

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

MSize gc_traverse_frames(global_State *g,lua_State *th)

{
  uint64_t uVar1;
  long lVar2;
  TValue *local_48;
  TValue *local_40;
  TValue *ftop;
  GCfunc *fn;
  TValue *bot;
  TValue *top;
  TValue *frame;
  lua_State *th_local;
  global_State *g_local;
  
  bot = th->top + -1;
  uVar1 = (th->stack).ptr64;
  top = th->base + -1;
  while ((TValue *)(uVar1 + 8) < top) {
    local_40 = top;
    if (*(char *)((top[-1].u64 & 0x7fffffffffff) + 10) == '\0') {
      local_40 = top + (int)(uint)*(byte *)(*(long *)((top[-1].u64 & 0x7fffffffffff) + 0x20) + -0x5d
                                           );
    }
    if (bot < local_40) {
      bot = local_40;
    }
    if ((top->u64 & 3) == 0) {
      lVar2 = (ulong)((*(uint *)(top->u64 - 4) >> 8 & 0xff) + 2) * -8;
    }
    else {
      lVar2 = -(top->u64 & 0xfffffffffffffff8);
    }
    local_48 = (TValue *)((long)top + lVar2);
    top = local_48;
  }
  bot = bot + 1;
  if ((TValue *)(th->maxstack).ptr64 < bot) {
    bot = (TValue *)(th->maxstack).ptr64;
  }
  return (MSize)((long)((long)bot - uVar1) >> 3);
}

Assistant:

static MSize gc_traverse_frames(global_State *g, lua_State *th)
{
  TValue *frame, *top = th->top-1, *bot = tvref(th->stack);
  /* Note: extra vararg frame not skipped, marks function twice (harmless). */
  for (frame = th->base-1; frame > bot+LJ_FR2; frame = frame_prev(frame)) {
    GCfunc *fn = frame_func(frame);
    TValue *ftop = frame;
    if (isluafunc(fn)) ftop += funcproto(fn)->framesize;
    if (ftop > top) top = ftop;
    if (!LJ_FR2) gc_markobj(g, fn);  /* Need to mark hidden function (or L). */
  }
  top++;  /* Correct bias of -1 (frame == base-1). */
  if (top > tvref(th->maxstack)) top = tvref(th->maxstack);
  return (MSize)(top - bot);  /* Return minimum needed stack size. */
}